

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O2

Result * __thiscall bssl::CertPathBuilder::Run(Result *__return_storage_ptr__,CertPathBuilder *this)

{
  pointer puVar1;
  Result *pRVar2;
  bool bVar3;
  CertErrors *pCVar4;
  size_t sVar5;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  result_path;
  uint32_t iteration_count;
  char *local_58;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  local_50;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  local_48;
  Result *local_40;
  set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_> *local_38;
  
  iteration_count = 0;
  local_38 = &this->user_initial_policy_set_;
  local_58 = "Internal error";
  local_40 = __return_storage_ptr__;
  while( true ) {
    ::std::make_unique<bssl::CertPathBuilderResultPath>();
    bVar3 = CertPathIter::GetNextPath
                      ((this->cert_path_iter_)._M_t.
                       super___uniq_ptr_impl<bssl::CertPathIter,_std::default_delete<bssl::CertPathIter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathIter_*,_std::default_delete<bssl::CertPathIter>_>
                       .super__Head_base<0UL,_bssl::CertPathIter_*,_false>._M_head_impl,
                       (ParsedCertificateList *)
                       result_path._M_t.
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                       ,(CertificateTrust *)
                        ((long)result_path._M_t.
                               super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                               .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                               _M_head_impl + 0x18),
                       (CertPathErrors *)
                       ((long)result_path._M_t.
                              super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                              _M_head_impl + 0x58),this->delegate_,&iteration_count,
                       this->max_iteration_count_,this->max_path_building_depth_);
    if (!bVar3) break;
    bVar3 = CertificateTrust::HasUnspecifiedTrust
                      ((CertificateTrust *)
                       ((long)result_path._M_t.
                              super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                              _M_head_impl + 0x18));
    if (bVar3) {
      bVar3 = CertPathErrors::ContainsHighSeverityErrors
                        ((CertPathErrors *)
                         ((long)result_path._M_t.
                                super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                                _M_head_impl + 0x58));
      if (!bVar3) {
        pCVar4 = CertPathErrors::GetOtherErrors
                           ((CertPathErrors *)
                            ((long)result_path._M_t.
                                   super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                   .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                                   _M_head_impl + 0x58));
        CertErrors::AddError(pCVar4,local_58);
      }
    }
    else {
      VerifyCertificateChain
                ((ParsedCertificateList *)
                 result_path._M_t.
                 super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl,
                 (CertificateTrust *)
                 ((long)result_path._M_t.
                        super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                        .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                        _M_head_impl + 0x18),&this->delegate_->super_VerifyCertificateChainDelegate,
                 &this->time_,this->key_purpose_,this->initial_explicit_policy_,local_38,
                 this->initial_policy_mapping_inhibit_,this->initial_any_policy_inhibit_,
                 (set<bssl::der::Input,_std::less<bssl::der::Input>,_std::allocator<bssl::der::Input>_>
                  *)((long)result_path._M_t.
                           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                           _M_head_impl + 0x20),
                 (CertPathErrors *)
                 ((long)result_path._M_t.
                        super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                        .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                        _M_head_impl + 0x58));
    }
    (*(this->delegate_->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
      [6])(this->delegate_,this,
           result_path._M_t.
           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           ._M_t.
           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl);
    bVar3 = CertPathBuilderResultPath::IsValid
                      ((CertPathBuilderResultPath *)
                       result_path._M_t.
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                      );
    local_50 = (unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                )(unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                  )result_path._M_t.
                   super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    result_path._M_t.
    super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ._M_t.
    super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl =
         (__uniq_ptr_data<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>,_true,_true>
          )(__uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
            )0x0;
    AddResultPath(this,&local_50);
    ::std::
    unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ::~unique_ptr(&local_50);
    if ((bVar3) &&
       (sVar5 = this->valid_path_count_ + 1, this->valid_path_count_ = sVar5,
       this->valid_path_limit_ != 0 && sVar5 == this->valid_path_limit_)) goto LAB_00383595;
    ::std::
    unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ::~unique_ptr(&result_path);
  }
  bVar3 = CertPathErrors::ContainsError
                    ((CertPathErrors *)
                     ((long)result_path._M_t.
                            super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                            .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                            _M_head_impl + 0x58),"Iteration limit exceeded");
  if (bVar3) {
    (this->out_result_).exceeded_iteration_limit = true;
  }
  bVar3 = CertPathErrors::ContainsError
                    ((CertPathErrors *)
                     ((long)result_path._M_t.
                            super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                            .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                            _M_head_impl + 0x58),"Deadline exceeded");
  if (bVar3) {
    (this->out_result_).exceeded_deadline = true;
  }
  if (*(long *)result_path._M_t.
               super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl !=
      *(long *)((long)result_path._M_t.
                      super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                      .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
               + 8)) {
    bVar3 = CertPathErrors::ContainsHighSeverityErrors
                      ((CertPathErrors *)
                       ((long)result_path._M_t.
                              super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                              .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                              _M_head_impl + 0x58));
    if (!bVar3) {
      pCVar4 = CertPathErrors::GetOtherErrors
                         ((CertPathErrors *)
                          ((long)result_path._M_t.
                                 super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                                 .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                                 _M_head_impl + 0x58));
      CertErrors::AddError(pCVar4,local_58);
    }
    (*(this->delegate_->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
      [6])(this->delegate_,this,
           result_path._M_t.
           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           ._M_t.
           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl);
    local_48 = (unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                )(unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                  )result_path._M_t.
                   super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    result_path._M_t.
    super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ._M_t.
    super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl =
         (__uniq_ptr_data<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>,_true,_true>
          )(__uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
            )0x0;
    AddResultPath(this,&local_48);
    ::std::
    unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ::~unique_ptr(&local_48);
  }
LAB_00383595:
  pRVar2 = local_40;
  (this->out_result_).iteration_count = iteration_count;
  puVar1 = (this->out_result_).paths.
           super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (local_40->paths).
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->out_result_).paths.
       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_40->paths).
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (local_40->paths).
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->out_result_).paths.
       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->out_result_).paths.
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->out_result_).paths.
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->out_result_).paths.
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = (this->out_result_).exceeded_deadline;
  local_40->exceeded_iteration_limit = (this->out_result_).exceeded_iteration_limit;
  local_40->exceeded_deadline = bVar3;
  local_40->best_result_index = (this->out_result_).best_result_index;
  local_40->iteration_count = (this->out_result_).iteration_count;
  local_40->max_depth_seen = (this->out_result_).max_depth_seen;
  ::std::
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  ::~unique_ptr(&result_path);
  return pRVar2;
}

Assistant:

CertPathBuilder::Result CertPathBuilder::Run() {
  uint32_t iteration_count = 0;

  while (true) {
    std::unique_ptr<CertPathBuilderResultPath> result_path =
        std::make_unique<CertPathBuilderResultPath>();

    if (!cert_path_iter_->GetNextPath(
            &result_path->certs, &result_path->last_cert_trust,
            &result_path->errors, delegate_, &iteration_count,
            max_iteration_count_, max_path_building_depth_)) {
      // There are no more paths to check or limits were exceeded.
      if (result_path->errors.ContainsError(
              cert_errors::kIterationLimitExceeded)) {
        out_result_.exceeded_iteration_limit = true;
      }
      if (result_path->errors.ContainsError(cert_errors::kDeadlineExceeded)) {
        out_result_.exceeded_deadline = true;
      }
      if (!result_path->certs.empty()) {
        // It shouldn't be possible to get here without adding one of the
        // errors above, but just in case, add an error if there isn't one
        // already.
        if (!result_path->errors.ContainsHighSeverityErrors()) {
          result_path->errors.GetOtherErrors()->AddError(
              cert_errors::kInternalError);
        }

        // Allow the delegate to do any processing or logging of the partial
        // path. (This is for symmetry for the other CheckPathAfterVerification
        // which also gets called on partial paths.)
        delegate_->CheckPathAfterVerification(*this, result_path.get());

        AddResultPath(std::move(result_path));
      }
      out_result_.iteration_count = iteration_count;
      return std::move(out_result_);
    }

    if (result_path->last_cert_trust.HasUnspecifiedTrust()) {
      // Partial path, don't attempt to verify. Just double check that it is
      // marked with an error, and move on.
      if (!result_path->errors.ContainsHighSeverityErrors()) {
        result_path->errors.GetOtherErrors()->AddError(
            cert_errors::kInternalError);
      }
    } else {
      // Verify the entire certificate chain.
      VerifyCertificateChain(
          result_path->certs, result_path->last_cert_trust, delegate_, time_,
          key_purpose_, initial_explicit_policy_, user_initial_policy_set_,
          initial_policy_mapping_inhibit_, initial_any_policy_inhibit_,
          &result_path->user_constrained_policy_set, &result_path->errors);
    }

    // Give the delegate a chance to add errors to the path.
    delegate_->CheckPathAfterVerification(*this, result_path.get());

    bool path_is_good = result_path->IsValid();

    AddResultPath(std::move(result_path));

    if (path_is_good) {
      valid_path_count_++;
      if (valid_path_limit_ > 0 && valid_path_count_ == valid_path_limit_) {
        out_result_.iteration_count = iteration_count;
        // Found enough paths, return immediately.
        return std::move(out_result_);
      }
    }
    // Path did not verify. Try more paths.
  }
}